

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char(&)[46],char,unsigned_short>
          (String *__return_storage_ptr__,kj *this,char (*params) [46],char *params_1,
          unsigned_short *params_2)

{
  undefined1 local_41;
  CappedArray<char,_8UL> local_40;
  ArrayPtr<const_char> local_30;
  
  local_30 = toCharSequence<char(&)[46]>((char (*) [46])this);
  local_41 = (*params)[0];
  local_40 = toCharSequence<unsigned_short>((unsigned_short *)params_1);
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&local_41,
             (FixedArray<char,_1UL> *)&local_40,(CappedArray<char,_8UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}